

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

Hop_Obj_t * Abc_ObjHopFromGia(Hop_Man_t *pHopMan,Gia_Man_t *p,int GiaId,Vec_Ptr_t *vCopies)

{
  int iVar1;
  int *piVar2;
  Hop_Obj_t *pHVar3;
  long lVar4;
  
  iVar1 = Gia_ObjIsLut(p,GiaId);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsLut(p, GiaId)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                  ,0x2b5,"Hop_Obj_t *Abc_ObjHopFromGia(Hop_Man_t *, Gia_Man_t *, int, Vec_Ptr_t *)")
    ;
  }
  iVar1 = Gia_ObjLutSize(p,GiaId);
  if (0 < iVar1) {
    Gia_ManIncrementTravId(p);
    lVar4 = 0;
    while( true ) {
      iVar1 = Gia_ObjLutSize(p,GiaId);
      if (iVar1 <= lVar4) break;
      piVar2 = Gia_ObjLutFanins(p,GiaId);
      iVar1 = piVar2[lVar4];
      Gia_ObjSetTravIdCurrentId(p,iVar1);
      pHVar3 = Hop_IthVar(pHopMan,(int)lVar4);
      Vec_PtrWriteEntry(vCopies,iVar1,pHVar3);
      lVar4 = lVar4 + 1;
    }
    pHVar3 = Abc_ObjHopFromGia_rec(pHopMan,p,GiaId,vCopies);
    return pHVar3;
  }
  __assert_fail("Gia_ObjLutSize(p, GiaId) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                ,0x2b6,"Hop_Obj_t *Abc_ObjHopFromGia(Hop_Man_t *, Gia_Man_t *, int, Vec_Ptr_t *)");
}

Assistant:

Hop_Obj_t * Abc_ObjHopFromGia( Hop_Man_t * pHopMan, Gia_Man_t * p, int GiaId, Vec_Ptr_t * vCopies )
{
    int k, iFan;
    assert( Gia_ObjIsLut(p, GiaId) );
    assert( Gia_ObjLutSize(p, GiaId) > 0 );
    Gia_ManIncrementTravId( p );
    Gia_LutForEachFanin( p, GiaId, iFan, k )
    {
        Gia_ObjSetTravIdCurrentId(p, iFan);
        Vec_PtrWriteEntry( vCopies, iFan, Hop_IthVar(pHopMan, k) );
    }
    return Abc_ObjHopFromGia_rec( pHopMan, p, GiaId, vCopies );
}